

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QScrollerPrivate::ScrollSegment>::relocate
          (QArrayDataPointer<QScrollerPrivate::ScrollSegment> *this,qsizetype offset,
          ScrollSegment **data)

{
  ScrollSegment *d_first;
  ScrollSegment *pSVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QScrollerPrivate::ScrollSegment,long_long>
            (this->ptr,this->size,d_first);
  if (data != (ScrollSegment **)0x0) {
    pSVar1 = *data;
    if ((this->ptr <= pSVar1) && (pSVar1 < this->ptr + this->size)) {
      *data = pSVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }